

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O2

void __thiscall
UnixMakefileGenerator::writeDefaultVariables(UnixMakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  bool bVar2;
  QTextStream *pQVar3;
  QArrayDataPointer<ProString> *pQVar4;
  long in_FS_OFFSET;
  ProKey local_1d8;
  ProString local_1a8;
  ProKey local_178;
  ProString distname;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  ProKey local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::writeDefaultVariables(&this->super_MakefileGenerator,t);
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"TAR           = ");
  ProKey::ProKey((ProKey *)&distname,"QMAKE_TAR");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_68,this,&distname);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_68);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"COMPRESS      = ");
  ProKey::ProKey((ProKey *)&distname,"QMAKE_GZIP");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_68,this,&distname);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_68);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&distname,"QMAKE_DISTNAME");
  bVar2 = QMakeProject::isEmpty(pQVar1,(ProKey *)&distname);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
  if (bVar2) {
    distname.m_file = -0x55555556;
    distname._36_4_ = 0xaaaaaaaa;
    distname.m_hash = 0xaaaaaaaaaaaaaaaa;
    distname.m_string.d.size = -0x5555555555555556;
    distname.m_offset = -0x55555556;
    distname.m_length = -0x55555556;
    distname.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    distname.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_ORIG_TARGET");
    QMakeEvaluator::first(&distname,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    pQVar1 = (this->super_MakefileGenerator).project;
    QString::QString(&local_68.m_string,"no_dist_version");
    bVar2 = QMakeProject::isActiveConfig(pQVar1,&local_68.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (!bVar2) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_98,"VERSION");
      QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_98);
      ProString::operator+=(&distname,&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    }
    ProStringList::ProStringList((ProStringList *)&local_98,&distname);
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_DISTNAME");
    pQVar4 = (QArrayDataPointer<ProString> *)
             QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    QArrayDataPointer<ProString>::operator=(pQVar4,(QArrayDataPointer<ProString> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"DISTNAME      = ");
  ProKey::ProKey((ProKey *)&distname,"QMAKE_DISTNAME");
  MakefileGenerator::fileVar(&local_68.m_string,&this->super_MakefileGenerator,(ProKey *)&distname);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_68);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&distname,"QMAKE_DISTDIR");
  bVar2 = QMakeProject::isEmpty(pQVar1,(ProKey *)&distname);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
  if (bVar2) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_DISTNAME");
    QMakeEvaluator::first(&distname,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    ProStringList::ProStringList((ProStringList *)&local_178,&distname);
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_98,"QMAKE_DISTDIR");
    pQVar4 = (QArrayDataPointer<ProString> *)
             QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_98);
    QArrayDataPointer<ProString>::operator=(pQVar4,(QArrayDataPointer<ProString> *)&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&distname);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"DISTDIR = ");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_98,"OBJECTS_DIR");
  bVar2 = QMakeProject::isEmpty(pQVar1,&local_98);
  if (bVar2) {
    ProString::ProString(&local_68,".tmp/");
  }
  else {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_178,"OBJECTS_DIR");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_178);
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_1d8,"QMAKE_DISTDIR");
  QMakeEvaluator::first(&local_1a8,&pQVar1->super_QMakeEvaluator,&local_1d8);
  QStringBuilder<ProString,_ProString>::QStringBuilder
            ((QStringBuilder<ProString,_ProString> *)&distname,&local_68,&local_1a8);
  QStringBuilder<ProString,_ProString>::convertTo<QString>
            ((QString *)&local_e0,(QStringBuilder<ProString,_ProString> *)&distname);
  MakefileGenerator::fileFixify
            ((QString *)&local_c8,&this->super_MakefileGenerator,(QString *)&local_e0,
             (FileFixifyTypes)0x5,true);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (&local_b0,this,&local_c8);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_b0);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QStringBuilder<ProString,_ProString>::~QStringBuilder
            ((QStringBuilder<ProString,_ProString> *)&distname);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (!bVar2) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::writeDefaultVariables(QTextStream &t)
{
    MakefileGenerator::writeDefaultVariables(t);
    t << "TAR           = " << var("QMAKE_TAR") << Qt::endl;
    t << "COMPRESS      = " << var("QMAKE_GZIP") << Qt::endl;

    if (project->isEmpty("QMAKE_DISTNAME")) {
        ProString distname = project->first("QMAKE_ORIG_TARGET");
        if (!project->isActiveConfig("no_dist_version"))
            distname += project->first("VERSION");
        project->values("QMAKE_DISTNAME") = distname;
    }
    t << "DISTNAME      = " << fileVar("QMAKE_DISTNAME") << Qt::endl;

    if (project->isEmpty("QMAKE_DISTDIR"))
        project->values("QMAKE_DISTDIR") = project->first("QMAKE_DISTNAME");
    t << "DISTDIR = " << escapeFilePath(fileFixify(
            (project->isEmpty("OBJECTS_DIR") ? ProString(".tmp/") : project->first("OBJECTS_DIR")) + project->first("QMAKE_DISTDIR"),
            FileFixifyFromOutdir | FileFixifyAbsolute)) << Qt::endl;
}